

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_compress_image(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  size_t __size;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  char local_248 [8];
  char card [81];
  long local_1e8;
  long ntrows;
  long trowsize;
  long i5;
  long i4;
  long i3;
  long i2;
  long i1;
  long i0;
  long tilesize [6];
  long tile [6];
  long lpixel [6];
  long fpixel [6];
  long naxes [6];
  long incre [6];
  long tilelen;
  long maxtilelen;
  undefined8 uStack_70;
  float fltnull;
  double dblnull;
  double dummy;
  long lStack_58;
  int naxis;
  long row;
  long ii;
  int local_40;
  int datatype;
  int gotnulls;
  int anynul;
  double *tiledata;
  int *status_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  local_40 = 0;
  dblnull = 0.0;
  uStack_70 = 0xb8a83e285ebab4b7;
  maxtilelen._4_4_ = 0x8541f136;
  tiledata = (double *)status;
  status_local = &outfptr->HDUposition;
  outfptr_local = infptr;
  memset(naxes + 5,0,0x30);
  naxes[5] = 1;
  if (*(int *)tiledata < 1) {
    __size = *(size_t *)(*(long *)(status_local + 2) + 0x4c8);
    if (*(int *)(*(long *)(status_local + 2) + 0x48c) == -0x20) {
      ii._4_4_ = 0x2a;
      if (*(int *)(*(long *)(status_local + 2) + 0x43c) == 0x29) {
        _gotnulls = (double *)malloc(__size << 3);
      }
      else {
        _gotnulls = (double *)malloc(__size << 2);
      }
    }
    else if (*(int *)(*(long *)(status_local + 2) + 0x48c) == -0x40) {
      ii._4_4_ = 0x52;
      _gotnulls = (double *)malloc(__size << 3);
    }
    else if (*(int *)(*(long *)(status_local + 2) + 0x48c) == 0x10) {
      ii._4_4_ = 0x15;
      if (((*(int *)(*(long *)(status_local + 2) + 0x43c) == 0xb) ||
          (*(int *)(*(long *)(status_local + 2) + 0x43c) == 0x15)) ||
         ((*(int *)(*(long *)(status_local + 2) + 0x43c) == 0x16 ||
          ((*(int *)(*(long *)(status_local + 2) + 0x43c) == 0x33 ||
           (*(int *)(*(long *)(status_local + 2) + 0x43c) == -1)))))) {
        _gotnulls = (double *)malloc(__size << 1);
      }
      else {
        _gotnulls = (double *)malloc(__size << 2);
      }
    }
    else if (*(int *)(*(long *)(status_local + 2) + 0x48c) == 8) {
      ii._4_4_ = 0xb;
      if ((((*(int *)(*(long *)(status_local + 2) + 0x43c) == 0xb) ||
           (*(int *)(*(long *)(status_local + 2) + 0x43c) == 0x33)) ||
          (*(int *)(*(long *)(status_local + 2) + 0x43c) == 0x15)) ||
         (*(int *)(*(long *)(status_local + 2) + 0x43c) == 0x16)) {
        _gotnulls = (double *)malloc(__size);
      }
      else {
        _gotnulls = (double *)malloc(__size << 2);
      }
    }
    else {
      if (*(int *)(*(long *)(status_local + 2) + 0x48c) != 0x20) {
        ffpmsg("Bad image datatype. (imcomp_compress_image)");
        *(undefined4 *)tiledata = 0x71;
        return 0x71;
      }
      ii._4_4_ = 0x1f;
      if (*(int *)(*(long *)(status_local + 2) + 0x43c) == 0x29) {
        _gotnulls = (double *)malloc(__size << 3);
      }
      else {
        _gotnulls = (double *)malloc(__size << 2);
      }
    }
    if (_gotnulls == (double *)0x0) {
      ffpmsg("Out of memory. (imcomp_compress_image)");
      *(undefined4 *)tiledata = 0x71;
      infptr_local._4_4_ = 0x71;
    }
    else {
      dummy._4_4_ = *(int *)(*(long *)(status_local + 2) + 0x490);
      for (row = 0; row < 6; row = row + 1) {
        if (row < dummy._4_4_) {
          fpixel[row + 5] = *(long *)(*(long *)(status_local + 2) + 0x498 + row * 8);
          tilesize[row + -1] = *(long *)(*(long *)(status_local + 2) + 0x440 + row * 8);
        }
        else {
          fpixel[row + 5] = 1;
          tilesize[row + -1] = 1;
        }
      }
      lStack_58 = 1;
      for (trowsize = 1; trowsize <= naxes[4]; trowsize = tilesize[4] + trowsize) {
        fpixel[4] = trowsize;
        if (trowsize + tilesize[4] + -1 < naxes[4]) {
          local_250 = trowsize + tilesize[4] + -1;
        }
        else {
          local_250 = naxes[4];
        }
        lpixel[4] = local_250;
        tile[4] = (local_250 - trowsize) + 1;
        for (i5 = 1; i5 <= naxes[3]; i5 = tilesize[3] + i5) {
          fpixel[3] = i5;
          if (i5 + tilesize[3] + -1 < naxes[3]) {
            local_258 = i5 + tilesize[3] + -1;
          }
          else {
            local_258 = naxes[3];
          }
          lpixel[3] = local_258;
          tile[3] = (local_258 - i5) + 1;
          for (i4 = 1; i4 <= naxes[2]; i4 = tilesize[2] + i4) {
            fpixel[2] = i4;
            if (i4 + tilesize[2] + -1 < naxes[2]) {
              local_260 = i4 + tilesize[2] + -1;
            }
            else {
              local_260 = naxes[2];
            }
            lpixel[2] = local_260;
            tile[2] = (local_260 - i4) + 1;
            for (i3 = 1; i3 <= naxes[1]; i3 = tilesize[1] + i3) {
              fpixel[1] = i3;
              if (i3 + tilesize[1] + -1 < naxes[1]) {
                local_268 = i3 + tilesize[1] + -1;
              }
              else {
                local_268 = naxes[1];
              }
              lpixel[1] = local_268;
              tile[1] = (local_268 - i3) + 1;
              for (i2 = 1; i2 <= naxes[0]; i2 = tilesize[0] + i2) {
                fpixel[0] = i2;
                if (i2 + tilesize[0] + -1 < naxes[0]) {
                  local_270 = i2 + tilesize[0] + -1;
                }
                else {
                  local_270 = naxes[0];
                }
                lpixel[0] = local_270;
                tile[0] = (local_270 - i2) + 1;
                for (i1 = 1; i1 <= fpixel[5]; i1 = i0 + i1) {
                  lpixel[5] = i1;
                  if (i1 + i0 + -1 < fpixel[5]) {
                    local_278 = i1 + i0 + -1;
                  }
                  else {
                    local_278 = fpixel[5];
                  }
                  tile[5] = local_278;
                  tilesize[5] = (local_278 - i1) + 1;
                  incre[5] = tilesize[5];
                  for (row = 1; row < dummy._4_4_; row = row + 1) {
                    incre[5] = tilesize[row + 5] * incre[5];
                  }
                  datatype = 0;
                  if (ii._4_4_ == 0x2a) {
                    ffgsve(outfptr_local,1,dummy._4_4_,fpixel + 5,lpixel + 5,tile + 5,naxes + 5,
                           -9.11912e-36,(float *)_gotnulls,&datatype,(int *)tiledata);
                  }
                  else if (ii._4_4_ == 0x52) {
                    ffgsvd(outfptr_local,1,dummy._4_4_,fpixel + 5,lpixel + 5,tile + 5,naxes + 5,
                           -9.1191291391491e-36,_gotnulls,&datatype,(int *)tiledata);
                  }
                  else if (ii._4_4_ == 0x1f) {
                    ffgsvk(outfptr_local,1,dummy._4_4_,fpixel + 5,lpixel + 5,tile + 5,naxes + 5,0,
                           (int *)_gotnulls,&datatype,(int *)tiledata);
                  }
                  else if (ii._4_4_ == 0x15) {
                    ffgsvi(outfptr_local,1,dummy._4_4_,fpixel + 5,lpixel + 5,tile + 5,naxes + 5,0,
                           (short *)_gotnulls,&datatype,(int *)tiledata);
                  }
                  else {
                    if (ii._4_4_ != 0xb) {
                      ffpmsg("Error bad datatype of image tile to compress");
                      free(_gotnulls);
                      return *(int *)tiledata;
                    }
                    ffgsvb(outfptr_local,1,dummy._4_4_,fpixel + 5,lpixel + 5,tile + 5,naxes + 5,'\0'
                           ,(uchar *)_gotnulls,&datatype,(int *)tiledata);
                  }
                  fits_calc_tile_rows(tile + 5,lpixel + 5,dummy._4_4_,&ntrows,&local_1e8,
                                      (int *)tiledata);
                  if ((datatype == 0) || (ii._4_4_ != 0x2a)) {
                    if ((datatype == 0) || (ii._4_4_ != 0x52)) {
                      imcomp_compress_tile
                                ((fitsfile *)status_local,lStack_58,ii._4_4_,_gotnulls,incre[5],
                                 ntrows,local_1e8,0,&dblnull,(int *)tiledata);
                    }
                    else {
                      imcomp_compress_tile
                                ((fitsfile *)status_local,lStack_58,0x52,_gotnulls,incre[5],ntrows,
                                 local_1e8,1,&stack0xffffffffffffff90,(int *)tiledata);
                    }
                  }
                  else {
                    imcomp_compress_tile
                              ((fitsfile *)status_local,lStack_58,0x2a,_gotnulls,incre[5],ntrows,
                               local_1e8,1,(void *)((long)&maxtilelen + 4),(int *)tiledata);
                  }
                  if (datatype != 0) {
                    local_40 = 1;
                  }
                  if (0 < *(int *)tiledata) {
                    ffpmsg("Error writing compressed image to table");
                    free(_gotnulls);
                    return *(int *)tiledata;
                  }
                  lStack_58 = lStack_58 + 1;
                }
              }
            }
          }
        }
      }
      free(_gotnulls);
      if (local_40 != 0) {
        ffgcrd((fitsfile *)status_local,"ZCMPTYPE",local_248,(int *)tiledata);
        ffikyj((fitsfile *)status_local,"ZBLANK",-0x7fffffff,
               "null value in the compressed integer array",(int *)tiledata);
      }
      infptr_local._4_4_ = *(int *)tiledata;
    }
  }
  else {
    infptr_local._4_4_ = *(int *)tiledata;
  }
  return infptr_local._4_4_;
}

Assistant:

int imcomp_compress_image (fitsfile *infptr, fitsfile *outfptr, int *status)

/* This routine does the following:
        - reads an image one tile at a time
        - if it is a float or double image, then it tries to quantize the pixels
          into scaled integers.
        - it then compressess the integer pixels, or if the it was not
	  possible to quantize the floating point pixels, then it losslessly
	  compresses them with gzip
	- writes the compressed byte stream to the output FITS file
*/
{
    double *tiledata;
    int anynul, gotnulls = 0, datatype;
    long ii, row;
    int naxis;
    double dummy = 0., dblnull = DOUBLENULLVALUE;
    float fltnull = FLOATNULLVALUE;
    long maxtilelen, tilelen, incre[] = {1, 1, 1, 1, 1, 1};
    long naxes[MAX_COMPRESS_DIM], fpixel[MAX_COMPRESS_DIM];
    long lpixel[MAX_COMPRESS_DIM], tile[MAX_COMPRESS_DIM];
    long tilesize[MAX_COMPRESS_DIM];
    long i0, i1, i2, i3, i4, i5, trowsize, ntrows;
    char card[FLEN_CARD];

    if (*status > 0)
        return(*status);

    maxtilelen = (outfptr->Fptr)->maxtilelen;

    /* 
     Allocate buffer to hold 1 tile of data; size depends on which compression 
     algorithm is used:

      Rice and GZIP will compress byte, short, or int arrays without conversion.
      PLIO requires 4-byte int values, so byte and short arrays must be converted to int.
      HCompress internally converts byte or short values to ints, and
         converts int values to 8-byte longlong integers.
    */
    
    if ((outfptr->Fptr)->zbitpix == FLOAT_IMG)
    {
        datatype = TFLOAT;

        if ( (outfptr->Fptr)->compress_type == HCOMPRESS_1) {
	    /* need twice as much scratch space (8 bytes per pixel) */
            tiledata = (double*) malloc (maxtilelen * 2 *sizeof (float));	
	} else {
            tiledata = (double*) malloc (maxtilelen * sizeof (float));
	}
    }
    else if ((outfptr->Fptr)->zbitpix == DOUBLE_IMG)
    {
        datatype = TDOUBLE;
        tiledata = (double*) malloc (maxtilelen * sizeof (double));
    }
    else if ((outfptr->Fptr)->zbitpix == SHORT_IMG)
    {
        datatype = TSHORT;
        if ( (outfptr->Fptr)->compress_type == RICE_1  ||
	     (outfptr->Fptr)->compress_type == GZIP_1  ||
	     (outfptr->Fptr)->compress_type == GZIP_2  ||
	     (outfptr->Fptr)->compress_type == BZIP2_1 ||
             (outfptr->Fptr)->compress_type == NOCOMPRESS) {
	    /* only need  buffer of I*2 pixels for gzip, bzip2, and Rice */

            tiledata = (double*) malloc (maxtilelen * sizeof (short));	
	} else {
 	    /*  need  buffer of I*4 pixels for Hcompress and PLIO */
            tiledata = (double*) malloc (maxtilelen * sizeof (int));
        }
    }
    else if ((outfptr->Fptr)->zbitpix == BYTE_IMG)
    {

        datatype = TBYTE;
        if ( (outfptr->Fptr)->compress_type == RICE_1  ||
	     (outfptr->Fptr)->compress_type == BZIP2_1 ||
	     (outfptr->Fptr)->compress_type == GZIP_1  ||
	     (outfptr->Fptr)->compress_type == GZIP_2) {
	    /* only need  buffer of I*1 pixels for gzip, bzip2, and Rice */

            tiledata = (double*) malloc (maxtilelen);	
	} else {
 	    /*  need  buffer of I*4 pixels for Hcompress and PLIO */
            tiledata = (double*) malloc (maxtilelen * sizeof (int));
        }
    }
    else if ((outfptr->Fptr)->zbitpix == LONG_IMG)
    {
        datatype = TINT;
        if ( (outfptr->Fptr)->compress_type == HCOMPRESS_1) {
	    /* need twice as much scratch space (8 bytes per pixel) */

            tiledata = (double*) malloc (maxtilelen * 2 * sizeof (int));	
	} else {
 	    /* only need  buffer of I*4 pixels for gzip, bzip2,  Rice, and PLIO */

            tiledata = (double*) malloc (maxtilelen * sizeof (int));
        }
    }
    else
    {
	ffpmsg("Bad image datatype. (imcomp_compress_image)");
	return (*status = MEMORY_ALLOCATION);
    }
    
    if (tiledata == NULL)
    {
	ffpmsg("Out of memory. (imcomp_compress_image)");
	return (*status = MEMORY_ALLOCATION);
    }

    /*  calculate size of tile in each dimension */
    naxis = (outfptr->Fptr)->zndim;
    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        if (ii < naxis)
        {
             naxes[ii] = (outfptr->Fptr)->znaxis[ii];
             tilesize[ii] = (outfptr->Fptr)->tilesize[ii];
        }
        else
        {
            naxes[ii] = 1;
            tilesize[ii] = 1;
        }
    }
    row = 1;

    /* set up big loop over up to 6 dimensions */
    for (i5 = 1; i5 <= naxes[5]; i5 += tilesize[5])
    {
     fpixel[5] = i5;
     lpixel[5] = minvalue(i5 + tilesize[5] - 1, naxes[5]);
     tile[5] = lpixel[5] - fpixel[5] + 1;
     for (i4 = 1; i4 <= naxes[4]; i4 += tilesize[4])
     {
      fpixel[4] = i4;
      lpixel[4] = minvalue(i4 + tilesize[4] - 1, naxes[4]);
      tile[4] = lpixel[4] - fpixel[4] + 1;
      for (i3 = 1; i3 <= naxes[3]; i3 += tilesize[3])
      {
       fpixel[3] = i3;
       lpixel[3] = minvalue(i3 + tilesize[3] - 1, naxes[3]);
       tile[3] = lpixel[3] - fpixel[3] + 1;
       for (i2 = 1; i2 <= naxes[2]; i2 += tilesize[2])
       {
        fpixel[2] = i2;
        lpixel[2] = minvalue(i2 + tilesize[2] - 1, naxes[2]);
        tile[2] = lpixel[2] - fpixel[2] + 1;
        for (i1 = 1; i1 <= naxes[1]; i1 += tilesize[1])
        {
         fpixel[1] = i1;
         lpixel[1] = minvalue(i1 + tilesize[1] - 1, naxes[1]);
         tile[1] = lpixel[1] - fpixel[1] + 1;
         for (i0 = 1; i0 <= naxes[0]; i0 += tilesize[0])
         {
          fpixel[0] = i0;
          lpixel[0] = minvalue(i0 + tilesize[0] - 1, naxes[0]);
          tile[0] = lpixel[0] - fpixel[0] + 1;

          /* number of pixels in this tile */
          tilelen = tile[0];
          for (ii = 1; ii < naxis; ii++)
          {
             tilelen *= tile[ii];
          }

          /* read next tile of data from image */
	  anynul = 0;
          if (datatype == TFLOAT)
          {
              ffgsve(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  FLOATNULLVALUE, (float *) tiledata,  &anynul, status);
          }
          else if (datatype == TDOUBLE)
          {
              ffgsvd(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  DOUBLENULLVALUE, tiledata, &anynul, status);
          }
          else if (datatype == TINT)
          {
              ffgsvk(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  0, (int *) tiledata,  &anynul, status);
          }
          else if (datatype == TSHORT)
          {
              ffgsvi(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  0, (short *) tiledata,  &anynul, status);
          }
          else if (datatype == TBYTE)
          {
              ffgsvb(infptr, 1, naxis, naxes, fpixel, lpixel, incre, 
                  0, (unsigned char *) tiledata,  &anynul, status);
          }
          else 
          {
              ffpmsg("Error bad datatype of image tile to compress");
              free(tiledata);
              return (*status);
          }

          /* now compress the tile, and write to row of binary table */
          /*   NOTE: we don't have to worry about the presence of null values in the
	       array if it is an integer array:  the null value is simply encoded
	       in the compressed array just like any other pixel value.  
	       
	       If it is a floating point array, then we need to check for null
	       only if the anynul parameter returned a true value when reading the tile
	  */
          
          /* Collapse sizes of higher dimension tiles into 2 dimensional
             equivalents needed by the quantizing algorithms for
             floating point types */
          fits_calc_tile_rows(lpixel, fpixel, naxis, &trowsize,
                            &ntrows, status);

          if (anynul && datatype == TFLOAT) {
              imcomp_compress_tile(outfptr, row, datatype, tiledata, tilelen,
                               trowsize, ntrows, 1, &fltnull, status);
          } else if (anynul && datatype == TDOUBLE) {
              imcomp_compress_tile(outfptr, row, datatype, tiledata, tilelen,
                               trowsize, ntrows, 1, &dblnull, status);
          } else {
              imcomp_compress_tile(outfptr, row, datatype, tiledata, tilelen,
                               trowsize, ntrows, 0, &dummy, status);
          }

          /* set flag if we found any null values */
          if (anynul)
              gotnulls = 1;

          /* check for any error in the previous operations */
          if (*status > 0)
          {
              ffpmsg("Error writing compressed image to table");
              free(tiledata);
              return (*status);
          }

	  row++;
         }
        }
       }
      }
     }
    }

    free (tiledata);  /* finished with this buffer */

    /* insert ZBLANK keyword if necessary; only for TFLOAT or TDOUBLE images */
    if (gotnulls)
    {
          ffgcrd(outfptr, "ZCMPTYPE", card, status);
          ffikyj(outfptr, "ZBLANK", COMPRESS_NULL_VALUE, 
             "null value in the compressed integer array", status);
    }

    return (*status);
}